

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O2

char * string_feeder_next_length(string_feeder_t *sf,size_t length)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  char *pcVar4;
  int i;
  size_t sVar5;
  size_t sVar6;
  
  if (sf == (string_feeder_t *)0x0) {
    __assert_fail("sf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x1f6,"char *string_feeder_next_length(string_feeder_t *, size_t)");
  }
  uVar1 = sf->len;
  uVar2 = sf->pos;
  if (uVar2 <= uVar1) {
    sVar6 = uVar1 - uVar2;
    if (uVar2 + length <= uVar1) {
      sVar6 = length;
    }
    pcVar4 = (char *)calloc(sVar6 + 1,1);
    for (sVar5 = 0; sVar6 != sVar5; sVar5 = sVar5 + 1) {
      cVar3 = string_feeder_next(sf);
      pcVar4[sVar5] = cVar3;
    }
    return pcVar4;
  }
  __assert_fail("sf->pos <= sf->len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x1f8,"char *string_feeder_next_length(string_feeder_t *, size_t)");
}

Assistant:

char *string_feeder_next_length(string_feeder_t *sf, size_t length)
{
    assert(sf != NULL);
    assert(length >= 0);
    assert(sf->pos <= sf->len);

    if (sf->pos + length > sf->len)
        length = sf->len - sf->pos;

    char *substr = calloc(length+1, sizeof(char));
    for (int i = 0 ; i < length ; i++)
        substr[i] = string_feeder_next(sf);
    return substr;
}